

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_json_reader<std::ifstream&>
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          basic_ifstream<char,_std::char_traits<char>_> *source,basic_json_visitor<char> *visitor,
          allocator<char> *temp_alloc)

{
  default_json_parsing *in_RDX;
  basic_json_decode_options<char> *in_RSI;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *this_00;
  allocator<char> *in_stack_fffffffffffffec8;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  basic_ifstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffef0;
  
  this_00 = (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
            &stack0xfffffffffffffed8;
  basic_json_decode_options<char>::basic_json_decode_options(in_RSI);
  std::function<bool(jsoncons::json_errc,jsoncons::ser_context_const&)>::
  function<jsoncons::default_json_parsing,void>(this_00,in_RDX);
  basic_json_reader<std::ifstream&>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (basic_json_visitor<char> *)in_stack_fffffffffffffee0,
             (basic_json_decode_options<char> *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x48ff61);
  basic_json_decode_options<char>::~basic_json_decode_options(in_RSI);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source, 
                          basic_json_visitor<CharT>& visitor, 
                          const TempAllocator& temp_alloc = TempAllocator())
            : basic_json_reader(std::forward<Sourceable>(source),
                                visitor,
                                basic_json_decode_options<CharT>(),
                                default_json_parsing(),
                                temp_alloc)
        {
        }